

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O0

float __thiscall masc::polygon::c_ply::getArcLength(c_ply *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  double dVar2;
  Point<double,_2> local_40;
  undefined8 local_30;
  Point2d *p2;
  Point2d *p1;
  ply_vertex *next;
  ply_vertex *ptr;
  c_ply *this_local;
  
  if ((this->arclength == -3.4028235e+38) && (!NAN(this->arclength))) {
    this->arclength = 0.0;
    next = this->head;
    ptr = (ply_vertex *)this;
    do {
      iVar1 = (*next->_vptr_ply_vertex[3])();
      p1 = (Point2d *)CONCAT44(extraout_var,iVar1);
      iVar1 = (*next->_vptr_ply_vertex[2])();
      p2 = (Point2d *)CONCAT44(extraout_var_00,iVar1);
      local_30 = (**(code **)((long)p1->v[0] + 0x10))();
      mathtool::Point<double,_2>::operator-(&local_40,p2);
      dVar2 = mathtool::Vector<double,_2>::norm((Vector<double,_2> *)&local_40);
      this->arclength = (float)((double)this->arclength + dVar2);
      next = (ply_vertex *)p1;
    } while ((ply_vertex *)p1 != this->head);
  }
  return this->arclength;
}

Assistant:

float c_ply::getArcLength()
{
	if (arclength == -FLT_MAX){
		arclength = 0;
		ply_vertex * ptr = head;
		do{
			ply_vertex * next = ptr->getNext();
			const Point2d& p1 = ptr->getPos();
			const Point2d& p2 = next->getPos();
			arclength += (p1 - p2).norm();
			ptr = next;
		} while (ptr != head); //end while
	}

	return arclength;
}